

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  Arena *pAVar4;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  MessageLite *pMVar3;
  
  pAVar4 = (Arena *)(submessage->_internal_metadata_).ptr_;
  if (((ulong)pAVar4 & 2) == 0) {
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar4 = (Arena *)0x0;
  }
  if (pAVar4 != submessage_arena) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fa);
    pLVar2 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: Arena::InternalHelper<MessageLite>::GetOwningArena(submessage) == submessage_arena: "
                       );
    LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
    LogMessage::~LogMessage(&local_60);
  }
  if (message_arena == submessage_arena) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fb);
    pLVar2 = LogMessage::operator<<(&local_98,"CHECK failed: message_arena != submessage_arena: ");
    LogFinisher::operator=((LogFinisher *)&local_d0,pLVar2);
    LogMessage::~LogMessage(&local_98);
  }
  if (submessage_arena != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fc);
    pLVar2 = LogMessage::operator<<(&local_d0,"CHECK failed: (submessage_arena) == (nullptr): ");
    LogFinisher::operator=(&local_d1,pLVar2);
    LogMessage::~LogMessage(&local_d0);
  }
  if (message_arena == (Arena *)0x0 || submessage_arena != (Arena *)0x0) {
    iVar1 = (*submessage->_vptr_MessageLite[3])(submessage,message_arena);
    pMVar3 = (MessageLite *)CONCAT44(extraout_var,iVar1);
    (*pMVar3->_vptr_MessageLite[7])(pMVar3,submessage);
  }
  else {
    pMVar3 = submessage;
    if (submessage != (MessageLite *)0x0) {
      ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)message_arena,submessage,
                 arena_delete_object<google::protobuf::MessageLite>);
    }
  }
  return pMVar3;
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  GOOGLE_DCHECK(Arena::InternalHelper<MessageLite>::GetOwningArena(submessage) ==
         submessage_arena);
  GOOGLE_DCHECK(message_arena != submessage_arena);
  GOOGLE_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}